

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall AbstractTxIn_IsCoinBaseTest_Test::TestBody(AbstractTxIn_IsCoinBaseTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_408;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  string local_3b8;
  Txid local_398;
  AbstractTxIn local_378;
  string local_2e8;
  AssertHelper local_2c8;
  Message local_2c0;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__2;
  AbstractTxIn not_coinbase;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__1;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  AbstractTxIn coinbase_input;
  uint32_t sequence;
  uint32_t max_vout;
  ByteData256 local_48;
  undefined1 local_30 [8];
  Txid empty_txid;
  AbstractTxIn_IsCoinBaseTest_Test *this_local;
  
  empty_txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ByteData256::ByteData256(&local_48);
  cfd::core::Txid::Txid((Txid *)local_30,&local_48);
  cfd::core::ByteData256::~ByteData256(&local_48);
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)&gtest_ar_.message_,(Txid *)local_30,0xffffffff,0xffffffff);
  local_101 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(internal *)local_100,(AssertionResult *)"coinbase_input.IsCoinBase()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)&gtest_ar__1.message_,(Txid *)local_30,0xffffffff,0);
  cfd::core::AbstractTxIn::operator=
            ((AbstractTxIn *)&gtest_ar_.message_,(AbstractTxIn *)&gtest_ar__1.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)&gtest_ar__1.message_);
  local_1d9 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &not_coinbase.script_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1d8,
               (AssertionResult *)"coinbase_input.IsCoinBase()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string
              ((string *)
               &not_coinbase.script_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)&gtest_ar__2.message_,(Txid *)local_30,0,0xffffffff);
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)&gtest_ar__2.message_);
  local_2b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e8,(internal *)local_2b0,(AssertionResult *)"not_coinbase.IsCoinBase()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3b8,"0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"
             ,(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
  cfd::core::Txid::Txid(&local_398,&local_3b8);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_378,&local_398,0xffffffff,0xffffffff);
  cfd::core::AbstractTxIn::operator=((AbstractTxIn *)&gtest_ar__2.message_,&local_378);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_378);
  cfd::core::Txid::~Txid(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)&gtest_ar__2.message_);
  local_3d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_408,(internal *)local_3d0,(AssertionResult *)"not_coinbase.IsCoinBase()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)&gtest_ar__2.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)&gtest_ar_.message_);
  cfd::core::Txid::~Txid((Txid *)local_30);
  return;
}

Assistant:

TEST(AbstractTxIn, IsCoinBaseTest) {
  const Txid empty_txid = Txid(ByteData256());
  const uint32_t max_vout = std::numeric_limits<uint32_t>::max();
  const uint32_t sequence = 4294967295;
  AbstractTxIn coinbase_input = AbstractTxIn(
    empty_txid, max_vout, sequence);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  coinbase_input = AbstractTxIn(
    empty_txid, max_vout, 0);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  AbstractTxIn not_coinbase = AbstractTxIn(
    empty_txid, 0, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());

  not_coinbase = AbstractTxIn(
    Txid("0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"),
    max_vout, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());
}